

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProbeContainer.cpp
# Opt level: O0

bool __thiscall
Js::ProbeContainer::GetNextUserStatementOffsetHelper
          (ProbeContainer *this,FunctionBody *functionBody,int currentOffset,
          StatementAdjustmentType adjType,int *nextStatementOffset)

{
  code *pcVar1;
  bool bVar2;
  StatementAdjustmentType SVar3;
  int iVar4;
  int iVar5;
  BOOL BVar6;
  uint uVar7;
  undefined4 *puVar8;
  WriteBarrierPtr *this_00;
  StatementMap **ppSVar9;
  StatementAdjustmentRecord local_60;
  StatementAdjustmentRecord adjRecord;
  StatementMap *pNextStatementMap;
  StatementMap *pSStack_48;
  int nextMapIndex;
  StatementMap *pStatementMap;
  StatementMapList *pSStack_38;
  int index;
  StatementMapList *pStatementMaps;
  int *nextStatementOffset_local;
  StatementAdjustmentType adjType_local;
  FunctionBody *pFStack_20;
  int currentOffset_local;
  FunctionBody *functionBody_local;
  ProbeContainer *this_local;
  
  pStatementMaps = (StatementMapList *)nextStatementOffset;
  nextStatementOffset_local._2_2_ = adjType;
  nextStatementOffset_local._4_4_ = currentOffset;
  pFStack_20 = functionBody;
  functionBody_local = (FunctionBody *)this;
  if (functionBody == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/ProbeContainer.cpp"
                                ,0x2e2,"(functionBody)","functionBody");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  if (pStatementMaps == (StatementMapList *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/ProbeContainer.cpp"
                                ,0x2e3,"(nextStatementOffset)","nextStatementOffset");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  pSStack_38 = FunctionBody::GetStatementMaps(pFStack_20);
  if ((pSStack_38 != (StatementMapList *)0x0) &&
     (iVar4 = JsUtil::
              ReadOnlyList<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_DefaultComparer>::
              Count(&pSStack_38->
                     super_ReadOnlyList<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_DefaultComparer>
                   ), 1 < iVar4)) {
    for (pStatementMap._4_4_ = 0; iVar4 = pStatementMap._4_4_,
        iVar5 = JsUtil::
                ReadOnlyList<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_DefaultComparer>::
                Count(&pSStack_38->
                       super_ReadOnlyList<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_DefaultComparer>
                     ), iVar4 < iVar5 + -1; pStatementMap._4_4_ = pStatementMap._4_4_ + 1) {
      this_00 = (WriteBarrierPtr *)
                JsUtil::
                List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item(pSStack_38,pStatementMap._4_4_);
      ppSVar9 = Memory::WriteBarrierPtr::operator_cast_to_StatementMap__(this_00);
      pSStack_48 = *ppSVar9;
      if (((pSStack_48->isSubexpression & 1U) == 0) &&
         (bVar2 = regex::Interval::Includes
                            (&pSStack_48->byteCodeSpan,nextStatementOffset_local._4_4_), bVar2)) {
        pNextStatementMap._4_4_ = pStatementMap._4_4_ + 1;
        adjRecord = (StatementAdjustmentRecord)
                    FunctionBody::
                    GetNextNonSubexpressionStatementMap<JsUtil::List<Js::FunctionBody::StatementMap*,Memory::Recycler,false,Js::CopyRemovePolicy,DefaultComparer>>
                              (pSStack_38,(int *)((long)&pNextStatementMap + 4));
        if (adjRecord != (StatementAdjustmentRecord)0x0) {
          FunctionBody::StatementAdjustmentRecord::StatementAdjustmentRecord(&local_60);
          if ((((pSStack_48->byteCodeSpan).end < *(int *)((long)adjRecord + 8)) &&
              (BVar6 = FunctionBody::GetBranchOffsetWithin
                                 (pFStack_20,(pSStack_48->byteCodeSpan).end,
                                  *(uint *)((long)adjRecord + 8),&local_60), BVar6 != 0)) &&
             (SVar3 = FunctionBody::StatementAdjustmentRecord::GetAdjustmentType(&local_60),
             (SVar3 & nextStatementOffset_local._2_2_) != SAT_None)) {
            uVar7 = FunctionBody::StatementAdjustmentRecord::GetByteCodeOffset(&local_60);
            if (uVar7 <= (uint)(pSStack_48->byteCodeSpan).end) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar8 = 1;
              bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/ProbeContainer.cpp"
                                          ,0x2fb,
                                          "(adjRecord.GetByteCodeOffset() > (uint)pStatementMap->byteCodeSpan.end)"
                                          ,
                                          "adjRecord.GetByteCodeOffset() > (uint)pStatementMap->byteCodeSpan.end"
                                         );
              if (!bVar2) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar8 = 0;
            }
            uVar7 = FunctionBody::StatementAdjustmentRecord::GetByteCodeOffset(&local_60);
            *(uint *)&(pStatementMaps->
                      super_ReadOnlyList<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_DefaultComparer>
                      )._vptr_ReadOnlyList = uVar7;
          }
          else {
            *(undefined4 *)
             &(pStatementMaps->
              super_ReadOnlyList<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_DefaultComparer>
              )._vptr_ReadOnlyList = *(undefined4 *)((long)adjRecord + 8);
          }
          return true;
        }
        break;
      }
    }
  }
  *(undefined4 *)
   &(pStatementMaps->
    super_ReadOnlyList<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_DefaultComparer>).
    _vptr_ReadOnlyList = 0xffffffff;
  return false;
}

Assistant:

bool ProbeContainer::GetNextUserStatementOffsetHelper(
        Js::FunctionBody* functionBody, int currentOffset, FunctionBody::StatementAdjustmentType adjType, int* nextStatementOffset)
    {
        Assert(functionBody);
        Assert(nextStatementOffset);

        FunctionBody::StatementMapList* pStatementMaps = functionBody->GetStatementMaps();
        if (pStatementMaps && pStatementMaps->Count() > 1)
        {
            for (int index = 0; index < pStatementMaps->Count() - 1; index++)
            {
                FunctionBody::StatementMap* pStatementMap = pStatementMaps->Item(index);

                if (!pStatementMap->isSubexpression && pStatementMap->byteCodeSpan.Includes(currentOffset))
                {
                    int nextMapIndex = index;
                    FunctionBody::StatementMap* pNextStatementMap = Js::FunctionBody::GetNextNonSubexpressionStatementMap(pStatementMaps, ++nextMapIndex);
                    if (!pNextStatementMap)
                    {
                        break;
                    }

                    // We are trying to find out the Branch opcode, between current and next statement. Skipping that would give use incorrect execution order.
                    FunctionBody::StatementAdjustmentRecord adjRecord;
                    if (pNextStatementMap->byteCodeSpan.begin > pStatementMap->byteCodeSpan.end &&
                        functionBody->GetBranchOffsetWithin(pStatementMap->byteCodeSpan.end, pNextStatementMap->byteCodeSpan.begin, &adjRecord) &&
                        (adjRecord.GetAdjustmentType() & adjType))
                    {
                        Assert(adjRecord.GetByteCodeOffset() > (uint)pStatementMap->byteCodeSpan.end);
                        *nextStatementOffset = adjRecord.GetByteCodeOffset();
                    }
                    else
                    {
                        *nextStatementOffset = pNextStatementMap->byteCodeSpan.begin;
                    }
                    return true;
                }
            }
        }

        *nextStatementOffset = -1;
        return false;
    }